

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cmpi_pcdi_8(m68k_info *info)

{
  uint imm;
  
  if ((info->type & 0x1e) != 0) {
    imm = read_imm_8(info);
    build_imm_ea(info,0x32,'\x01',imm);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cmpi_pcdi_8(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_imm_ea(info, M68K_INS_CMPI, 1, read_imm_8(info));
}